

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_partition.c
# Opt level: O0

aom_codec_err_t
av1_ext_part_create(aom_ext_part_funcs_t funcs,aom_ext_part_config_t config,
                   ExtPartController *ext_part_controller)

{
  int iVar1;
  undefined4 *in_RSI;
  undefined4 in_EDI;
  aom_ext_part_status_t status;
  aom_codec_err_t local_4;
  
  if (in_RSI == (undefined4 *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    memcpy(in_RSI + 6,&stack0x00000008,0x38);
    in_RSI[2] = in_EDI;
    iVar1 = (**(code **)(in_RSI + 6))(*(undefined8 *)(in_RSI + 0x12),in_RSI + 2,in_RSI + 4);
    if (iVar1 == 1) {
      local_4 = AOM_CODEC_ERROR;
    }
    else if (iVar1 == 2) {
      in_RSI[1] = 1;
      *in_RSI = 0;
      local_4 = AOM_CODEC_OK;
    }
    else {
      *in_RSI = 1;
      local_4 = AOM_CODEC_OK;
    }
  }
  return local_4;
}

Assistant:

aom_codec_err_t av1_ext_part_create(aom_ext_part_funcs_t funcs,
                                    aom_ext_part_config_t config,
                                    ExtPartController *ext_part_controller) {
  if (ext_part_controller == NULL) {
    return AOM_CODEC_INVALID_PARAM;
  }
  ext_part_controller->funcs = funcs;
  ext_part_controller->config = config;
  const aom_ext_part_status_t status = ext_part_controller->funcs.create_model(
      ext_part_controller->funcs.priv, &ext_part_controller->config,
      &ext_part_controller->model);
  if (status == AOM_EXT_PART_ERROR) {
    return AOM_CODEC_ERROR;
  } else if (status == AOM_EXT_PART_TEST) {
    ext_part_controller->test_mode = 1;
    ext_part_controller->ready = 0;
    return AOM_CODEC_OK;
  }
  assert(status == AOM_EXT_PART_OK);
  ext_part_controller->ready = 1;
  return AOM_CODEC_OK;
}